

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::load_from_file
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  byte bVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  istream *this_00;
  double local_400;
  double point;
  vector<double,_std::allocator<double>_> line_of_heat_map;
  stringstream lineSS;
  ostream local_3d0 [376];
  string local_258 [8];
  string temp;
  istream local_228 [8];
  ifstream in;
  bool dbg;
  char *filename_local;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open(local_228,filename,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"The file : ");
    poVar2 = std::operator<<(poVar2,filename);
    std::operator<<(poVar2," do not exist. The program will now terminate \n");
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "The persistence landscape file do not exist. The program will now terminate \n";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  this_00 = (istream *)std::istream::operator>>(local_228,&this->min_);
  std::istream::operator>>(this_00,&this->max_);
  std::__cxx11::string::string(local_258);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
  while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::operator<<(local_3d0,local_258);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&point);
    while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
      std::istream::operator>>
                ((istream *)
                 &line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_400);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&point,&local_400);
    }
    bVar1 = std::ios::good();
    if ((bVar1 & 1) != 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&this->heat_map,(value_type *)&point);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&point);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &line_of_heat_map.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_258);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::load_from_file(const char* filename) {
  bool dbg = false;

  std::ifstream in;
  in.open(filename);

  // checking if the file exist / if it was open.
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  // now we read the file one by one.

  in >> this->min_ >> this->max_;
  if (dbg) {
    std::clog << "Reading the following values of min and max : " << this->min_ << " , " << this->max_ << std::endl;
  }

  std::string temp;
  std::getline(in, temp);
  while (in.good()) {
    std::getline(in, temp);
    std::stringstream lineSS;
    lineSS << temp;

    std::vector<double> line_of_heat_map;
    while (lineSS.good()) {
      double point;

      lineSS >> point;
      line_of_heat_map.push_back(point);
      if (dbg) {
        std::clog << point << " ";
      }
    }
    if (dbg) {
      std::clog << std::endl;
      getchar();
    }

    if (in.good()) this->heat_map.push_back(line_of_heat_map);
  }
  in.close();
  if (dbg) std::clog << "Done \n";
}